

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Buffer::remove_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  ulong uVar1;
  int iVar2;
  Fl_Text_Modify_Cb *pp_Var3;
  void **ppvVar4;
  long lVar5;
  Fl_Text_Modify_Cb *pp_Var6;
  void **ppvVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  iVar2 = this->mNModifyProcs;
  lVar11 = (long)iVar2;
  uVar8 = 0xffffffff;
  if (0 < lVar11) {
    lVar5 = 0;
    do {
      if ((this->mModifyProcs[lVar5] == bufModifiedCB) && (this->mCbArgs[lVar5] == cbArg)) {
        uVar8 = (uint)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar11 != lVar5);
  }
  if (uVar8 == 0xffffffff) {
    (*Fl::error)("Fl_Text_Buffer::remove_modify_callback(): Can\'t find modify CB to remove",
                 bufModifiedCB,cbArg,Fl::error);
    return;
  }
  uVar1 = lVar11 - 1;
  iVar10 = (int)uVar1;
  this->mNModifyProcs = iVar10;
  if (iVar10 == 0) {
    this->mNModifyProcs = 0;
    if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(this->mModifyProcs);
    }
    this->mModifyProcs = (Fl_Text_Modify_Cb *)0x0;
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
    this->mCbArgs = (void **)0x0;
  }
  else {
    uVar12 = uVar1 * 8;
    uVar9 = uVar12;
    if (iVar2 < 1) {
      uVar9 = 0xffffffffffffffff;
    }
    pp_Var6 = (Fl_Text_Modify_Cb *)operator_new__(uVar9);
    if (iVar2 < 1) {
      uVar12 = 0xffffffffffffffff;
    }
    ppvVar7 = (void **)operator_new__(uVar12);
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    else {
      pp_Var3 = this->mModifyProcs;
      ppvVar4 = this->mCbArgs;
      uVar9 = 0;
      do {
        pp_Var6[uVar9] = pp_Var3[uVar9];
        ppvVar7[uVar9] = ppvVar4[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if ((int)uVar9 < iVar10) {
      pp_Var3 = this->mModifyProcs;
      ppvVar4 = this->mCbArgs;
      uVar9 = uVar9 & 0xffffffff;
      do {
        pp_Var6[uVar9] = pp_Var3[uVar9 + 1];
        ppvVar7[uVar9] = ppvVar4[uVar9 + 1];
        uVar9 = uVar9 + 1;
      } while ((uVar1 & 0xffffffff) != uVar9);
    }
    if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(this->mModifyProcs);
    }
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
    this->mModifyProcs = pp_Var6;
    this->mCbArgs = ppvVar7;
  }
  return;
}

Assistant:

void Fl_Text_Buffer::remove_modify_callback(Fl_Text_Modify_Cb bufModifiedCB, 
                                            void *cbArg)
{
  int i, toRemove = -1;
  
  /* find the matching callback to remove */
  for (i = 0; i < mNModifyProcs; i++) {
    if (mModifyProcs[i] == bufModifiedCB && mCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_modify_callback(): Can't find modify CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if
   any are left) */
  mNModifyProcs--;
  if (mNModifyProcs == 0) {
    mNModifyProcs = 0;
    delete[]mModifyProcs;
    mModifyProcs = NULL;
    delete[]mCbArgs;
    mCbArgs = NULL;
    return;
  }
  Fl_Text_Modify_Cb *newModifyProcs = new Fl_Text_Modify_Cb[mNModifyProcs];
  void **newCBArgs = new void *[mNModifyProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newModifyProcs[i] = mModifyProcs[i];
    newCBArgs[i] = mCbArgs[i];
  }
  for (; i < mNModifyProcs; i++) {
    newModifyProcs[i] = mModifyProcs[i + 1];
    newCBArgs[i] = mCbArgs[i + 1];
  }
  delete[]mModifyProcs;
  delete[]mCbArgs;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}